

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O1

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,int32_t value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e6a10;
  p_Var1[1]._M_use_count = value;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR_equals_001e6a60;
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  return;
}

Assistant:

MsgPack::MsgPack(int32_t value)                    : m_ptr(make_shared<MsgPackInt32>(value)) {}